

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

int __thiscall fmt::SystemError::init(SystemError *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CStringRef in_RCX;
  fmt *in_RDX;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  ArgList args;
  StringRef message;
  MemoryWriter w;
  string local_278;
  runtime_error local_258 [16];
  BasicMemoryWriter<char,_std::allocator<char>_> local_248;
  
  this->error_code_ = (int)ctx;
  local_248.super_BasicWriter<char>.buffer_ = &local_248.buffer_.super_Buffer<char>;
  local_248.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001cc408;
  local_248.buffer_.super_Buffer<char>.ptr_ = local_248.buffer_.data_;
  local_248.buffer_.super_Buffer<char>.size_ = 0;
  local_248.buffer_.super_Buffer<char>.capacity_ = 500;
  local_248.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001cc450;
  args.field_1.values_ = in_R8.values_;
  args.types_ = (uint64_t)in_R8;
  format_abi_cxx11_(&local_278,in_RDX,in_RCX,args);
  message.size_ = (size_t)in_R8.values_;
  message.data_ = (char *)local_278._M_string_length;
  internal::format_system_error
            ((internal *)&local_248,(Writer *)((ulong)ctx & 0xffffffff),
             (int)local_278._M_dataplus._M_p,message);
  std::__cxx11::string::~string((string *)&local_278);
  BasicWriter<char>::str_abi_cxx11_(&local_278,&local_248.super_BasicWriter<char>);
  std::runtime_error::runtime_error(local_258,(string *)&local_278);
  std::runtime_error::operator=((runtime_error *)this,local_258);
  std::runtime_error::~runtime_error(local_258);
  std::__cxx11::string::~string((string *)&local_278);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_248);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void fmt::SystemError::init(
    int err_code, CStringRef format_str, ArgList args) {
  error_code_ = err_code;
  MemoryWriter w;
  internal::format_system_error(w, err_code, format(format_str, args));
  std::runtime_error &base = *this;
  base = std::runtime_error(w.str());
}